

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cargo.c
# Opt level: O0

void cargo_set_errorv(cargo_t ctx,cargo_err_flags_t flags,char *fmt,__va_list_tag *ap)

{
  char *local_40;
  char *error2;
  char *error;
  __va_list_tag *p_Stack_28;
  int ret;
  __va_list_tag *ap_local;
  char *fmt_local;
  cargo_t pcStack_10;
  cargo_err_flags_t flags_local;
  cargo_t ctx_local;
  
  error._4_4_ = 0;
  error2 = (char *)0x0;
  local_40 = (char *)0x0;
  p_Stack_28 = ap;
  ap_local = (__va_list_tag *)fmt;
  fmt_local._4_4_ = flags;
  pcStack_10 = ctx;
  if (ctx == (cargo_t)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_c_cmakelists/JoakimSoderberg[P]cargo/cargo.c"
                  ,0x14d6,
                  "void cargo_set_errorv(cargo_t, cargo_err_flags_t, const char *, struct __va_list_tag *)"
                 );
  }
  error._4_4_ = cargo_vasprintf(&error2,fmt,ap);
  if (-1 < error._4_4_) {
    if (((pcStack_10->error != (char *)0x0) &&
        ((fmt_local._4_4_ & CARGO_ERR_APPEND) != CARGO_ERR_DEFAULT)) &&
       (error._4_4_ = cargo_asprintf(&local_40,"%s%s",pcStack_10->error,error2), -1 < error._4_4_))
    {
      _cargo_free(error2);
      error2 = local_40;
    }
    _cargo_xfree(&pcStack_10->error);
    pcStack_10->error = error2;
  }
  return;
}

Assistant:

void cargo_set_errorv(cargo_t ctx, cargo_err_flags_t flags,
                    const char *fmt, va_list ap)
{
    int ret = 0;
    char *error = NULL;
    char *error2 = NULL;
    assert(ctx);

    ret = cargo_vasprintf(&error, fmt, ap);

    if (ret >= 0)
    {
        // Maybe this can be done a bit nicer...
        if (ctx->error && (flags & CARGO_ERR_APPEND))
        {
            ret = cargo_asprintf(&error2, "%s%s", ctx->error, error);

            if (ret >= 0)
            {
                _cargo_free(error);
                error = error2;
            }
        }

        _cargo_xfree(&ctx->error);
        ctx->error = error;
    }
}